

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,LargestUInt value)

{
  char *current;
  UIntToStringBuffer buffer;
  allocator<char> local_41;
  char *local_40;
  char local_38 [25];
  char local_1f [15];
  
  local_40 = local_1f;
  uintToString((LargestUInt)this,&local_40);
  if (local_38 <= local_40) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,local_40,&local_41);
    return __return_storage_ptr__;
  }
  __assert_fail("current >= buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                ,0x9c,"std::string Json::valueToString(LargestUInt)");
}

Assistant:

JSONCPP_STRING valueToString(LargestUInt value) {
  UIntToStringBuffer buffer;
  char* current = buffer + sizeof(buffer);
  uintToString(value, current);
  assert(current >= buffer);
  return current;
}